

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDInt8x16Operation::OpNeg(SIMDValue *value)

{
  undefined1 auVar1 [16];
  SIMDValue SVar2;
  
  auVar1._0_8_ = CONCAT17(-(value->field_0).i8[7],
                          CONCAT16(-(value->field_0).i8[6],
                                   CONCAT15(-(value->field_0).i8[5],
                                            CONCAT14(-(value->field_0).i8[4],
                                                     CONCAT13(-(value->field_0).i8[3],
                                                              CONCAT12(-(value->field_0).i8[2],
                                                                       CONCAT11(-(value->field_0).i8
                                                                                 [1],-(value->
                                                  field_0).i8[0])))))));
  auVar1[8] = -(value->field_0).i8[8];
  auVar1[9] = -(value->field_0).i8[9];
  auVar1[10] = -(value->field_0).i8[10];
  auVar1[0xb] = -(value->field_0).i8[0xb];
  auVar1[0xc] = -(value->field_0).i8[0xc];
  auVar1[0xd] = -(value->field_0).i8[0xd];
  auVar1[0xe] = -(value->field_0).i8[0xe];
  auVar1[0xf] = -(value->field_0).i8[0xf];
  SVar2.field_0.i64[1] = auVar1._8_8_;
  SVar2.field_0.i64[0] = auVar1._0_8_;
  return (SIMDValue)SVar2.field_0;
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpNeg(const SIMDValue& value)
    {
        X86SIMDValue x86Result;

        X86SIMDValue SIGNMASK, temp;
        X86SIMDValue negativeOnes = { { -1, -1, -1, -1 } };
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        temp.m128i_value = _mm_andnot_si128(v.m128i_value, negativeOnes.m128i_value); // (~value) & (negative ones)
        SIGNMASK.m128i_value = _mm_set1_epi8(0x00000001);                            // set SIGNMASK to 1
        x86Result.m128i_value = _mm_add_epi8(SIGNMASK.m128i_value, temp.m128i_value);// add 16 integers respectively

        return X86SIMDValue::ToSIMDValue(x86Result);
    }